

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O0

Mat * __thiscall
ncnn::ModelBinFromMatArray::load(ModelBinFromMatArray *this,int param_2,int param_3)

{
  long in_RSI;
  Mat *in_RDI;
  Mat *m;
  
  if (*(long *)(in_RSI + 8) == 0) {
    Mat::Mat(in_RDI);
  }
  else {
    Mat::Mat(in_RDI,*(Mat **)(in_RSI + 8));
    *(long *)(in_RSI + 8) = *(long *)(in_RSI + 8) + 0x40;
  }
  return in_RDI;
}

Assistant:

Mat ModelBinFromMatArray::load(int /*w*/, int /*type*/) const
{
    if (!weights)
        return Mat();

    Mat m = weights[0];
    weights++;
    return m;
}